

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.hpp
# Opt level: O2

string * JSONFieldName(string *__return_storage_ptr__,string *name)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  allocator local_29;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
  pcVar1 = (name->_M_dataplus)._M_p;
  sVar2 = name->_M_string_length;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    if (pcVar1[sVar3] != '_') {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JSONFieldName(const std::string &name) {
    bool nextUppercase = false;
    std::string result = "";
    for (auto itr : name) {
        if (itr == '_') {
            nextUppercase = true;
        } else {
            char c = itr;
            if (nextUppercase) {
                if ('a' <= c and c <= 'z') {
                    c += 'A' - 'a';
                }
            }

            result += c;
            nextUppercase = false;
        }
    }
    return result;
}